

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::computeDivergence(MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Real dzi;
  Real dyi;
  Real dxi;
  MFIter mfi;
  long local_250;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  dVar1 = (geom->super_CoordSys).inv_dx[0];
  dVar2 = (geom->super_CoordSys).inv_dx[1];
  dVar3 = (geom->super_CoordSys).inv_dx[2];
  MFIter::MFIter(&local_90,(FabArrayBase *)divu,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&divu->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&umac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&umac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < (long)local_190.ncomp) {
        lVar7 = (long)local_1ac.smallend.vect[0] * 8;
        local_250 = 0;
        lVar8 = 0;
        do {
          iVar10 = local_1ac.smallend.vect[2];
          if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
            do {
              if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
                lVar5 = local_110.nstride * local_250 +
                        (iVar10 - local_110.begin.z) * local_110.kstride * 8 +
                        (long)local_110.begin.x * -8 + lVar7;
                lVar12 = (long)local_1ac.smallend.vect[1];
                do {
                  iVar4 = (int)lVar12;
                  if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                    lVar6 = (lVar12 - local_d0.begin.y) * local_d0.jstride * 8 +
                            local_d0.nstride * local_250 +
                            (iVar10 - local_d0.begin.z) * local_d0.kstride * 8 +
                            (long)local_d0.begin.x * -8 + lVar7;
                    lVar9 = (lVar12 - local_150.begin.y) * local_150.jstride * 8;
                    lVar11 = 0;
                    do {
                      *(double *)
                       ((long)local_190.p +
                       lVar11 * 8 +
                       (lVar12 - local_190.begin.y) * local_190.jstride * 8 +
                       local_190.nstride * local_250 +
                       (iVar10 - local_190.begin.z) * local_190.kstride * 8 +
                       (long)local_190.begin.x * -8 + lVar7) =
                           (*(double *)
                             ((long)local_150.p +
                             lVar11 * 8 +
                             lVar9 + local_150.kstride * 8 *
                                     (long)((iVar10 + 1) - local_150.begin.z) +
                                     local_150.nstride * local_250 + (long)local_150.begin.x * -8 +
                                     lVar7) -
                           *(double *)
                            ((long)local_150.p +
                            lVar11 * 8 +
                            lVar9 + (long)(iVar10 - local_150.begin.z) * local_150.kstride * 8 +
                                    local_150.nstride * local_250 + (long)local_150.begin.x * -8 +
                                    lVar7)) * dVar3 +
                           (*(double *)
                             ((long)local_110.p +
                             lVar11 * 8 +
                             (long)((iVar4 + 1) - local_110.begin.y) * local_110.jstride * 8 + lVar5
                             ) - *(double *)
                                  ((long)local_110.p +
                                  lVar11 * 8 +
                                  (lVar12 - local_110.begin.y) * local_110.jstride * 8 + lVar5)) *
                           dVar2 + (*(double *)((long)local_d0.p + lVar11 * 8 + lVar6 + 8) -
                                   *(double *)((long)local_d0.p + lVar11 * 8 + lVar6)) * dVar1;
                      lVar11 = lVar11 + 1;
                    } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 !=
                             (int)lVar11);
                  }
                  lVar12 = lVar12 + 1;
                } while (iVar4 + 1 != local_1ac.bigend.vect[1] + 1);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != local_1ac.bigend.vect[2] + 1);
          }
          lVar8 = lVar8 + 1;
          local_250 = local_250 + 8;
        } while (lVar8 != local_190.ncomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                            const Geometry& geom)
    {
        AMREX_D_TERM(AMREX_ASSERT(divu.nComp()==umac[0]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[1]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[2]->nComp()));

#if (AMREX_SPACEDIM==2)
        const auto& ba = divu.boxArray();
        const auto& dm = divu.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& divuarr = divu.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& uarr = umac[0]->const_array(mfi);,
                         Array4<Real const> const& varr = umac[1]->const_array(mfi);,
                         Array4<Real const> const& warr = umac[2]->const_array(mfi););

#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence_rz(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),dxinv);
                });
            }
        }
    }